

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall
Medicine::Medicine(Medicine *this,int id,int unitePrice,int quantity,bool isSold,string *name,
                  string *companyName,string *arrivalDate,string *expireDate)

{
  pointer pcVar1;
  
  this->id = id;
  this->unitePrice = unitePrice;
  this->quantity = quantity;
  this->isSold = isSold;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + name->_M_string_length);
  (this->companyName)._M_dataplus._M_p = (pointer)&(this->companyName).field_2;
  pcVar1 = (companyName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->companyName,pcVar1,pcVar1 + companyName->_M_string_length);
  (this->arrivalDate)._M_dataplus._M_p = (pointer)&(this->arrivalDate).field_2;
  pcVar1 = (arrivalDate->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->arrivalDate,pcVar1,pcVar1 + arrivalDate->_M_string_length);
  (this->expireDate)._M_dataplus._M_p = (pointer)&(this->expireDate).field_2;
  pcVar1 = (expireDate->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->expireDate,pcVar1,pcVar1 + expireDate->_M_string_length);
  return;
}

Assistant:

Medicine(int id, int unitePrice, int quantity, bool isSold, const string &name, const string &companyName,
             const string &arrivalDate, const string &expireDate) : id(id), unitePrice(unitePrice), quantity(quantity),
                                                                    isSold(isSold), name(name),
                                                                    companyName(companyName), arrivalDate(arrivalDate),
                                                                    expireDate(expireDate) {}